

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# end.c
# Opt level: O1

int num_extinctions(void)

{
  int iVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = 0x30593e;
  iVar1 = 0;
  lVar3 = 2;
  do {
    if (((&mvitals[0].born)[lVar3] & 3) != 0) {
      iVar1 = iVar1 + (uint)((*(byte *)(lVar2 + 1) & 0x10) == 0);
    }
    lVar3 = lVar3 + 3;
    lVar2 = lVar2 + 0x40;
  } while (lVar3 != 0x4bb);
  return iVar1;
}

Assistant:

int num_extinctions(void)
{
    int i, n = 0;

    for (i = LOW_PM; i < NUMMONS; i++)
	if ((mvitals[i].mvflags & G_GONE) && !(mons[i].geno & G_UNIQ))
	    n++;

    return n;
}